

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void codearith(FuncState *fs,OpCode op,expdesc *e1,expdesc *e2)

{
  double __x;
  double __y;
  int iVar1;
  int iVar2;
  uint uVar3;
  lua_Number lVar4;
  double dVar5;
  
  if (((((e1->k == VKNUM) && (e1->t == -1)) && (e1->f == -1)) && ((e2->k == VKNUM && (e2->t == -1)))
      ) && (e2->f == -1)) {
    lVar4 = 0.0;
    if (8 < op - OP_ADD) goto switchD_0010df8e_caseD_13;
    __x = (e1->u).nval;
    __y = (e2->u).nval;
    switch(op) {
    case OP_ADD:
      lVar4 = __x + __y;
      break;
    case OP_SUB:
      lVar4 = __x - __y;
      break;
    case OP_MUL:
      lVar4 = __x * __y;
      break;
    case OP_DIV:
      if ((__y != 0.0) || (NAN(__y))) {
        lVar4 = __x / __y;
        break;
      }
      goto LAB_0010deb6;
    case OP_MOD:
      if ((__y == 0.0) && (!NAN(__y))) goto LAB_0010deb6;
      dVar5 = floor(__x / __y);
      lVar4 = __x - dVar5 * __y;
      break;
    case OP_POW:
      lVar4 = pow(__x,__y);
      break;
    case OP_UNM:
      lVar4 = -__x;
      break;
    case OP_NOT:
      goto switchD_0010df8e_caseD_13;
    case OP_LEN:
      iVar1 = 0;
      goto LAB_0010dec3;
    }
    if (!NAN(lVar4)) {
switchD_0010df8e_caseD_13:
      (e1->u).nval = lVar4;
      return;
    }
  }
  iVar1 = 0;
  if ((op != OP_UNM) && (iVar1 = 0, op != OP_LEN)) {
LAB_0010deb6:
    iVar1 = luaK_exp2RK(fs,e2);
  }
LAB_0010dec3:
  iVar2 = luaK_exp2RK(fs,e1);
  if (iVar1 < iVar2) {
    if (((e1->k == VNONRELOC) && (uVar3 = (e1->u).s.info, (uVar3 >> 8 & 1) == 0)) &&
       ((int)(uint)fs->nactvar <= (int)uVar3)) {
      fs->freereg = fs->freereg + -1;
    }
    if (e2->k != VNONRELOC) goto LAB_0010df35;
    uVar3 = (e2->u).s.info;
  }
  else {
    if (((e2->k == VNONRELOC) && (uVar3 = (e2->u).s.info, (uVar3 >> 8 & 1) == 0)) &&
       ((int)(uint)fs->nactvar <= (int)uVar3)) {
      fs->freereg = fs->freereg + -1;
    }
    if (e1->k != VNONRELOC) goto LAB_0010df35;
    uVar3 = (e1->u).s.info;
  }
  if (((uVar3 >> 8 & 1) == 0) && ((int)(uint)fs->nactvar <= (int)uVar3)) {
    fs->freereg = fs->freereg + -1;
  }
LAB_0010df35:
  iVar1 = luaK_code(fs,iVar1 << 0xe | iVar2 << 0x17 | op,fs->ls->lastline);
  (e1->u).s.info = iVar1;
  e1->k = VRELOCABLE;
  return;
}

Assistant:

static void codearith(FuncState*fs,OpCode op,expdesc*e1,expdesc*e2){
if(constfolding(op,e1,e2))
return;
else{
int o2=(op!=OP_UNM&&op!=OP_LEN)?luaK_exp2RK(fs,e2):0;
int o1=luaK_exp2RK(fs,e1);
if(o1>o2){
freeexp(fs,e1);
freeexp(fs,e2);
}
else{
freeexp(fs,e2);
freeexp(fs,e1);
}
e1->u.s.info=luaK_codeABC(fs,op,0,o1,o2);
e1->k=VRELOCABLE;
}
}